

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool IsValidVertexEdgeLink
               (ON_SubDVertex *vertex,ON_SubDEdge *edge,ON__UINT_PTR end_index,bool bSilentError)

{
  uchar uVar1;
  ON_SubDEdgeTag OVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  ON_SubDSectorType st;
  ON_SubDSectorType OStack_48;
  
  if ((((vertex == (ON_SubDVertex *)0x0 || edge == (ON_SubDEdge *)0x0) ||
       (edge->m_vertex[end_index] != vertex)) ||
      (uVar1 = (vertex->super_ON_SubDComponentBase).m_level,
      uVar1 != (edge->super_ON_SubDComponentBase).m_level)) ||
     (((dVar7 = edge->m_sector_coefficient[end_index], dVar7 < 0.0 || (1.0 <= dVar7)) &&
      ((uVar1 != '\0' || ((dVar7 != -8883.0 || (NAN(dVar7))))))))) goto LAB_005ced7b;
  OVar2 = edge->m_edge_tag;
  if (OVar2 != SmoothX) {
    if (OVar2 == Crease) {
      if ((((dVar7 == 0.0) && (!NAN(dVar7))) && (vertex->m_vertex_tag != Unset)) &&
         (vertex->m_vertex_tag != Smooth)) {
        return true;
      }
      goto LAB_005ced7b;
    }
    if (OVar2 != Smooth) goto LAB_005ced7b;
  }
  if (vertex->m_vertex_tag == Smooth) {
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      return true;
    }
  }
  else {
    uVar5 = 3;
    lVar6 = 0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      if ((edge->m_vertex[lVar6] != (ON_SubDVertex *)0x0) &&
         ((byte)(edge->m_vertex[lVar6]->m_vertex_tag - Crease) < 3)) {
        if (uVar5 != 3) {
          lVar6 = 2;
        }
        uVar5 = (uint)lVar6;
      }
      lVar6 = 1;
      bVar3 = false;
    } while (bVar4);
    if (OVar2 == SmoothX) {
      if (uVar5 == 2) {
LAB_005ceda7:
        ON_SubDSectorType::Create(&OStack_48,edge,(uint)end_index);
        bVar3 = ON_SubDSectorType::IsValid(&OStack_48);
        if (((bVar3) &&
            (dVar7 = ON_SubDSectorType::SectorCoefficient(&OStack_48),
            dVar7 == edge->m_sector_coefficient[end_index])) && ((0.0 < dVar7 && (dVar7 < 1.0)))) {
          return true;
        }
        ON_SubDIncrementErrorCount();
        if (bSilentError) {
          return false;
        }
        bVar3 = ON_IsNotValid();
        return bVar3;
      }
    }
    else if (uVar5 == (uint)end_index) goto LAB_005ceda7;
  }
LAB_005ced7b:
  ON_SubDIncrementErrorCount();
  if (bSilentError) {
    return false;
  }
  bVar3 = ON_IsNotValid();
  return bVar3;
}

Assistant:

static bool IsValidVertexEdgeLink(
  const ON_SubDVertex* vertex,
  const ON_SubDEdge* edge,
  ON__UINT_PTR end_index,
  bool bSilentError
)
{
  if (nullptr == vertex || nullptr == edge)
    return ON_SubDIsNotValid(bSilentError);

  if (end_index > 1)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->m_vertex[end_index] != vertex)
    return ON_SubDIsNotValid(bSilentError);

  if (vertex->SubdivisionLevel() != edge->SubdivisionLevel())
    return ON_SubDIsNotValid(bSilentError);

  if (false == EdgeSectorCoefficientIsValid(edge->m_sector_coefficient[end_index],edge))
    return ON_SubDIsNotValid(bSilentError);

  if ( edge->IsSmooth() )
  {
    // edge->m_edge_tag is ON_SubDEdgeTag::Smooth or ON_SubDEdgeTag::SmoothX
    if (ON_SubDVertexTag::Smooth == vertex->m_vertex_tag)
    {
      if (false == (0.0 == edge->m_sector_coefficient[end_index]))
        return ON_SubDIsNotValid(bSilentError);
    }
    else
    {
      const unsigned int tagged_end_index = edge->TaggedEndIndex();
      if (ON_SubDEdgeTag::SmoothX == edge->m_edge_tag)
      {
        if (2 != tagged_end_index)
          return ON_SubDIsNotValid(bSilentError);
      }
      else
      {
        if (tagged_end_index != (unsigned int)end_index)
          return ON_SubDIsNotValid(bSilentError);
      }
       
      ON_SubDSectorType st = ON_SubDSectorType::Create(edge,(unsigned int)end_index);
      if (!st.IsValid())
        return ON_SubDIsNotValid(bSilentError);

      const double expected_sector_coefficient = st.SectorCoefficient();
      if (false == (expected_sector_coefficient == edge->m_sector_coefficient[end_index]))
        return ON_SubDIsNotValid(bSilentError);

      if (false == EdgeSectorCoefficientIsSet(expected_sector_coefficient))
        return ON_SubDIsNotValid(bSilentError);
    }
  }
  else if(ON_SubDEdgeTag::Crease == edge->m_edge_tag)
  {
    // crease edge
    if (!(0.0 == edge->m_sector_coefficient[end_index]))
      return ON_SubDIsNotValid(bSilentError);

    if (ON_SubDVertexTag::Smooth == vertex->m_vertex_tag)
      return ON_SubDIsNotValid(bSilentError);

    if (ON_SubDVertexTag::Unset == vertex->m_vertex_tag)
      return ON_SubDIsNotValid(bSilentError);
  }
  else
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  return true;
}